

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
kratos::Generator::remove_child_generator(Generator *this,shared_ptr<kratos::Generator> *child)

{
  element_type *peVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  long lVar5;
  undefined8 *puVar6;
  undefined1 local_f0 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sinks;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  size_type *local_80;
  string child_name;
  shared_ptr<kratos::Port> port;
  shared_ptr<kratos::Stmt> local_48;
  undefined1 local_32;
  undefined1 local_31;
  
  peVar1 = (child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_80 = &child_name._M_string_length;
  pcVar2 = (peVar1->instance_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + (peVar1->instance_name)._M_string_length);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((this->children_names_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->children_names_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(string *)&local_80);
  if (__position._M_current !=
      (this->children_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&this->children_names_,(iterator)__position._M_current);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->children_)._M_h,&local_80);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->children_comments_)._M_h,&local_80);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sinks._M_h._M_single_bucket,
               &(((child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->ports_)._M_t);
    if (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&port_names)
    {
      do {
        port_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        get_port((Generator *)((long)&child_name.field_2 + 8),
                 (string *)
                 (child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        uVar4 = child_name.field_2._8_8_;
        if (*(int *)(child_name.field_2._8_8_ + 0x270) == 0) {
          lVar5 = (**(code **)(*(long *)child_name.field_2._8_8_ + 0x80))(child_name.field_2._8_8_);
          uVar3 = *(undefined8 *)(lVar5 + 0x10);
          (**(code **)(*(long *)uVar4 + 0x80))(uVar4);
          std::
          _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _Hashtable<std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,true,false>>
                    ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_f0,uVar3,0,0,&local_48,&local_32,&local_31);
          for (puVar6 = (undefined8 *)sinks._M_h._M_bucket_count; puVar6 != (undefined8 *)0x0;
              puVar6 = (undefined8 *)*puVar6) {
            Var::unassign(*(Var **)(puVar6[1] + 200),(shared_ptr<kratos::AssignStmt> *)(puVar6 + 1))
            ;
            local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)puVar6[1];
            local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[2];
            if (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            remove_stmt_from_parent(&local_48);
            if (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
        }
        else {
          lVar5 = (**(code **)(*(long *)child_name.field_2._8_8_ + 0x70))(child_name.field_2._8_8_);
          uVar3 = *(undefined8 *)(lVar5 + 0x10);
          (**(code **)(*(long *)uVar4 + 0x70))(uVar4);
          std::
          _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _Hashtable<std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,true,false>>
                    ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_f0,uVar3,0,0,&local_48,&local_32,&local_31);
          for (puVar6 = (undefined8 *)sinks._M_h._M_bucket_count; puVar6 != (undefined8 *)0x0;
              puVar6 = (undefined8 *)*puVar6) {
            Var::unassign((Var *)child_name.field_2._8_8_,
                          (shared_ptr<kratos::AssignStmt> *)(puVar6 + 1));
            local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)puVar6[1];
            local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[2];
            if (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            remove_stmt_from_parent(&local_48);
            if (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
        }
        std::
        _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_f0);
        if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             std::_Rb_tree_increment
                       ((_Rb_tree_node_base *)
                        port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      } while (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
               (_Base_ptr)&port_names);
    }
    ((child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    parent_generator_ = (Generator *)0x0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sinks._M_h._M_single_bucket);
  }
  if (local_80 != &child_name._M_string_length) {
    operator_delete(local_80,child_name._M_string_length + 1);
  }
  return;
}

Assistant:

void Generator::remove_child_generator(const std::shared_ptr<Generator> &child) {
    auto child_name = child->instance_name;
    auto pos = std::find(children_names_.begin(), children_names_.end(), child_name);
    if (pos != children_names_.end()) {
        children_names_.erase(pos);
        children_.erase(child_name);
        children_comments_.erase(child_name);
        // need to remove every connected ports
        auto port_names = child->get_port_names();
        for (auto const &port_name : port_names) {
            auto port = child->get_port(port_name);
            if (port->port_direction() == PortDirection::In) {
                // do a copy
                auto srcs = std::unordered_set<std::shared_ptr<AssignStmt>>(port->sources().begin(),
                                                                            port->sources().end());
                for (auto const &stmt : srcs) {
                    auto *sink = stmt->right();
                    sink->unassign(stmt);
                    remove_stmt_from_parent(stmt);
                }
            } else {
                auto sinks = std::unordered_set<std::shared_ptr<AssignStmt>>(port->sinks().begin(),
                                                                             port->sinks().end());
                for (auto const &stmt : sinks) {
                    port->unassign(stmt);
                    remove_stmt_from_parent(stmt);
                }
            }
        }
        // set parent to null
        child->parent_generator_ = nullptr;
    }
}